

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

void * debug_lock_alloc(uint locktype)

{
  void *pvVar1;
  debug_lock *result;
  undefined4 *puStack_10;
  uint locktype_local;
  
  puStack_10 = (undefined4 *)event_mm_malloc_(0x20);
  if (puStack_10 == (undefined4 *)0x0) {
    puStack_10 = (undefined4 *)0x0;
  }
  else {
    if (original_lock_fns_.alloc == (_func_void_ptr_uint *)0x0) {
      *(undefined8 *)(puStack_10 + 6) = 0;
    }
    else {
      pvVar1 = (*original_lock_fns_.alloc)(locktype | 1);
      *(void **)(puStack_10 + 6) = pvVar1;
      if (pvVar1 == (void *)0x0) {
        event_mm_free_(puStack_10);
        return (void *)0x0;
      }
    }
    *puStack_10 = 0xdeb0b10c;
    puStack_10[1] = locktype;
    puStack_10[4] = 0;
    *(undefined8 *)(puStack_10 + 2) = 0;
  }
  return puStack_10;
}

Assistant:

static void *
debug_lock_alloc(unsigned locktype)
{
	struct debug_lock *result = mm_malloc(sizeof(struct debug_lock));
	if (!result)
		return NULL;
	if (original_lock_fns_.alloc) {
		if (!(result->lock = original_lock_fns_.alloc(
				locktype|EVTHREAD_LOCKTYPE_RECURSIVE))) {
			mm_free(result);
			return NULL;
		}
	} else {
		result->lock = NULL;
	}
	result->signature = DEBUG_LOCK_SIG;
	result->locktype = locktype;
	result->count = 0;
	result->held_by = 0;
	return result;
}